

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_flags
                 (lysc_ctx *ctx,uint16_t parsed_flags,uint16_t inherited_flags,lysc_node *node)

{
  uint16_t parent_flags_00;
  char *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *parent_name;
  uint16_t parent_flags;
  lysc_node *node_local;
  uint16_t inherited_flags_local;
  uint16_t parsed_flags_local;
  lysc_ctx *ctx_local;
  
  node->flags = parsed_flags & 0xe3;
  ctx_local._4_4_ = lys_compile_config(ctx,node);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (node->parent == (lysc_node *)0x0) {
      parent_flags_00 = 0;
    }
    else {
      parent_flags_00 = node->parent->flags;
    }
    if (node->parent == (lysc_node *)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      local_50 = node->parent->name;
    }
    ctx_local._4_4_ =
         lys_compile_status(ctx,parsed_flags,inherited_flags,parent_flags_00,local_50,node->name,
                            &node->flags);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      if (((ctx->compile_opts & 0x1000) == 0) || (node->nodetype == 0x1000)) {
        if (((ctx->compile_opts & 0x2000) == 0) || (node->nodetype == 0x2000)) {
          if (((ctx->compile_opts & 0x4000) != 0) && (node->nodetype != 0x400)) {
            node->flags = node->flags | 0x4000;
          }
        }
        else {
          node->flags = node->flags | 0x2000;
        }
      }
      else {
        node->flags = node->flags | 0x1000;
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_flags(struct lysc_ctx *ctx, uint16_t parsed_flags, uint16_t inherited_flags, struct lysc_node *node)
{
    uint16_t parent_flags;
    const char *parent_name;

    /* copy flags except for status */
    node->flags = (parsed_flags & LYS_FLAGS_COMPILED_MASK) & ~LYS_STATUS_MASK;

    /* inherit config flags */
    LY_CHECK_RET(lys_compile_config(ctx, node));

    /* compile status */
    parent_flags = node->parent ? node->parent->flags : 0;
    parent_name = node->parent ? node->parent->name : NULL;
    LY_CHECK_RET(lys_compile_status(ctx, parsed_flags, inherited_flags, parent_flags, parent_name, node->name, &node->flags));

    /* other flags */
    if ((ctx->compile_opts & LYS_IS_INPUT) && (node->nodetype != LYS_INPUT)) {
        node->flags |= LYS_IS_INPUT;
    } else if ((ctx->compile_opts & LYS_IS_OUTPUT) && (node->nodetype != LYS_OUTPUT)) {
        node->flags |= LYS_IS_OUTPUT;
    } else if ((ctx->compile_opts & LYS_IS_NOTIF) && (node->nodetype != LYS_NOTIF)) {
        node->flags |= LYS_IS_NOTIF;
    }

    return LY_SUCCESS;
}